

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_concurrent_prepared.cpp
# Opt level: O0

void RecreateTable(Connection *con)

{
  StringRef capturedExpression;
  byte bVar1;
  pointer pQVar2;
  PreparedStatement *in_RDI;
  AssertionHandler catchAssertionHandler;
  unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> result;
  unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
  prepare;
  idx_t i;
  undefined4 in_stack_fffffffffffffe68;
  Flags in_stack_fffffffffffffe6c;
  AssertionHandler *in_stack_fffffffffffffe70;
  StringRef *in_stack_fffffffffffffe78;
  AssertionHandler *this;
  undefined7 in_stack_fffffffffffffe88;
  string local_148 [32];
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  string local_108 [32];
  undefined1 local_e8 [56];
  StringRef local_b0;
  allocator local_39;
  string local_38 [32];
  string local_18 [8];
  ulong local_10;
  
  for (local_10 = 0; local_10 < 1000; local_10 = local_10 + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_38,"create or replace table foo as select * from foo",&local_39);
    duckdb::Connection::Prepare(local_18);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    duckdb::
    unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>::
    operator->((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                *)in_stack_fffffffffffffe70);
    duckdb::PreparedStatement::Execute<>(in_RDI);
    pQVar2 = duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
             ::operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                           *)in_stack_fffffffffffffe70);
    bVar1 = duckdb::BaseQueryResult::HasError();
    if ((bVar1 & 1) != 0) {
      local_b0 = operator____catch_sr
                           ((char *)in_stack_fffffffffffffe70,
                            CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      this = (AssertionHandler *)(local_e8 + 0x28);
      Catch::SourceLineInfo::SourceLineInfo
                ((SourceLineInfo *)this,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/test/sql/parallelism/interquery/test_concurrent_prepared.cpp"
                 ,0x18);
      local_e8._16_8_ = (char *)0x0;
      local_e8._24_8_ = 0;
      Catch::StringRef::StringRef((StringRef *)(local_e8 + 0x10));
      capturedExpression.m_start._7_1_ = bVar1;
      capturedExpression.m_start._0_7_ = in_stack_fffffffffffffe88;
      capturedExpression.m_size = (size_type)pQVar2;
      Catch::AssertionHandler::AssertionHandler
                (this,in_stack_fffffffffffffe78,(SourceLineInfo *)in_stack_fffffffffffffe70,
                 capturedExpression,in_stack_fffffffffffffe6c);
      local_128 = 0;
      uStack_120 = 0;
      local_118 = 0;
      Catch::MessageStream::MessageStream((MessageStream *)0x789997);
      Catch::StreamEndStop::operator+[abi_cxx11_
                ((StreamEndStop *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      in_stack_fffffffffffffe78 =
           (StringRef *)
           Catch::MessageStream::operator<<
                     ((MessageStream *)in_stack_fffffffffffffe70,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      Catch::ReusableStringStream::str_abi_cxx11_
                ((ReusableStringStream *)
                 CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      in_stack_fffffffffffffe70 = (AssertionHandler *)local_e8;
      Catch::StringRef::StringRef
                ((StringRef *)in_stack_fffffffffffffe70,
                 (string *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      Catch::AssertionHandler::handleMessage
                (in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,(StringRef *)0x789a05);
      std::__cxx11::string::~string(local_108);
      std::__cxx11::string::~string(local_148);
      Catch::MessageStream::~MessageStream((MessageStream *)0x789a28);
      Catch::AssertionHandler::complete(in_stack_fffffffffffffe70);
      Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffe70);
    }
    duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
    ~unique_ptr((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
                0x789b59);
    duckdb::
    unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>::
    ~unique_ptr((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                 *)0x789b66);
  }
  return;
}

Assistant:

static void RecreateTable(Connection con) {
	for (idx_t i = 0; i < 1000; i++) {
		auto prepare = con.Prepare("create or replace table foo as select * from foo");
		auto result = prepare->Execute();
		if (result->HasError()) {
			FAIL();
		}
	}
}